

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_shrinkToFit_success_hasNotLeastCapacity_fn(int _i)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  undefined8 uVar10;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.growStrategy = (ACUtilsGrowStrategy)0x0;
  array.capacity = 0;
  array.buffer = (char *)0x0;
  array.reallocator = private_ACUtilsTest_ADynArray_realloc;
  array.deallocator = private_ACUtilsTest_ADynArray_free;
  array.size = 7;
  array.capacity = private_ACUtils_ADynArray_growStrategyGeneric(9,8,0x20,2.0,0x20);
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  array.buffer = (char *)(*array.reallocator)((void *)0x0,array.capacity);
  if (array.size != 1) {
    uVar2 = 0;
    do {
      array.buffer[uVar2] = '5';
      uVar2 = uVar2 + 1;
    } while (uVar2 < array.size - 1);
  }
  array.buffer[array.size - 1] = '0';
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_shrinkToFit(&array,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x18d);
    if (array.size != 7) {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMin - 1";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == private_ACUtilsTest_ADynArray_capacityMin - 1";
      pcVar6 = "array.size";
      iVar4 = 0x18e;
      uVar10 = 7;
      sVar7 = array.size;
      goto LAB_0010ca1b;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x18e);
    if (array.capacity != 8) {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.capacity";
      iVar4 = 399;
      uVar10 = 8;
      sVar7 = array.capacity;
      goto LAB_0010ca1b;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,399);
    if (array.buffer == (char *)0x0) {
      pcVar5 = "(void*) array.buffer != NULL";
      pcVar6 = "(void*) array.buffer";
      iVar4 = 400;
LAB_0010cb6e:
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar4,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x",pcVar5,pcVar6,0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,400);
    lVar9 = 0;
    do {
      if ((long)array.buffer[lVar9] != 0x35) {
        pcVar8 = "\'5\'";
        pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar5 = "array.buffer[i] == \'5\'";
        pcVar6 = "array.buffer[i]";
        iVar4 = 0x192;
        uVar10 = 0x35;
        sVar7 = (long)array.buffer[lVar9];
        goto LAB_0010ca1b;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x192);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 6);
    if ((long)array.buffer[6] != 0x30) {
      pcVar8 = "\'0\'";
      pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2] == \'0\'";
      pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2]";
      iVar4 = 0x193;
      uVar10 = 0x30;
      sVar7 = (long)array.buffer[6];
      goto LAB_0010ca1b;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x193);
    if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
      pcVar5 = "(void*) array.growStrategy != NULL";
      pcVar6 = "(void*) array.growStrategy";
      iVar4 = 0x194;
      goto LAB_0010cb6e;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x194);
    if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x195);
      (*array.deallocator)(array.buffer);
      return;
    }
    pcVar8 = "1";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
    pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar4 = 0x195;
    sVar7 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar7 = (size_t)bVar1;
    pcVar8 = "true";
    pcVar5 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer)) == true";
    pcVar6 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer))";
    iVar4 = 0x18d;
  }
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  uVar10 = 1;
LAB_0010ca1b:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar4,"Assertion \'_ck_x == _ck_y\' failed",pcVar3,pcVar5,pcVar6,sVar7,pcVar8,
                    uVar10,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_shrinkToFit_success_hasNotLeastCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin - 1;
    array.capacity = private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char));
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_shrinkToFit(&array), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin - 1);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 2; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}